

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::ParseFromArray
          (PerfEventConfig_CallstackSampling *this,void *raw,size_t size)

{
  _Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false> _Var1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *end;
  uint uVar9;
  ulong uVar10;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint32_t local_58;
  ushort local_54;
  uint8_t local_52;
  PerfEventConfig_CallstackSampling *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  bitset<4UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar8 = 0;
  local_50 = this;
  do {
    if (end <= raw) goto switchD_002bee87_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar5 != (uint64_t *)raw) goto LAB_002bee50;
LAB_002bf1be:
      uVar8 = 0;
      uVar6 = 0;
      goto LAB_002bef84;
    }
    puVar5 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002bee50:
    uVar2 = preamble;
    uVar10 = preamble >> 3;
    uVar9 = (uint)uVar10;
    if ((uVar9 == 0) || (end <= puVar5)) goto LAB_002bf1be;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&int_value);
      uVar7 = 0;
      uVar6 = 0;
      if (puVar4 == puVar5) goto LAB_002bef84;
      break;
    case 1:
      puVar4 = puVar5 + 1;
      if (end < puVar4) goto switchD_002bee87_caseD_3;
      int_value = *puVar5;
LAB_002beed5:
      uVar7 = 0;
      break;
    case 2:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&payload_length)
      ;
      if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length))
      goto switchD_002bee87_caseD_3;
      puVar4 = (uint64_t *)((long)puVar3 + payload_length);
      uVar7 = payload_length;
      int_value = (uint64_t)puVar3;
      break;
    default:
      goto switchD_002bee87_caseD_3;
    case 5:
      puVar4 = (uint64_t *)((long)puVar5 + 4);
      if (puVar4 <= end) {
        int_value = (uint64_t)(uint)*puVar5;
        goto LAB_002beed5;
      }
      goto switchD_002bee87_caseD_3;
    }
    raw = puVar4;
  } while ((0xffff < uVar9) || (0xfffffff < uVar7));
  uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
  uVar6 = int_value;
LAB_002bef84:
  local_40 = &local_50->_has_field_;
LAB_002bef9a:
  do {
    preamble = uVar6;
    local_58 = (uint32_t)uVar8;
    local_52 = (uint8_t)(uVar8 >> 0x30);
    uVar9 = (uint)(uVar8 >> 0x20);
    local_54 = (ushort)(uVar8 >> 0x20);
    if (local_54 == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_54 < 4) {
      ::std::bitset<4UL>::set((bitset<4UL> *)local_40,(ulong)(uVar9 & 3),true);
      uVar9 = (uint)local_54;
    }
    if ((short)uVar9 == 3) {
      local_50->user_frames_ = (PerfEventConfig_UnwindMode)preamble;
    }
    else if ((uVar9 & 0xffff) == 2) {
      local_50->kernel_frames_ = preamble != 0;
    }
    else if ((uVar9 & 0xffff) == 1) {
      _Var1._M_head_impl =
           (local_50->scope_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::PerfEventConfig_Scope,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
           .super__Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false>.
           _M_head_impl;
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_CppMessageObj + 0x20))
                (_Var1._M_head_impl,preamble,local_58);
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                ((Field *)&preamble,local_48);
    }
    do {
      if (end <= raw) {
LAB_002bf19b:
        uVar8 = 0;
        uVar6 = 0;
        goto LAB_002bef9a;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar5 == (uint64_t *)raw) goto LAB_002bf19b;
      }
      else {
        puVar5 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar2 = int_value;
      uVar10 = int_value >> 3;
      uVar9 = (uint)uVar10;
      if ((uVar9 == 0) || (end <= puVar5)) goto LAB_002bf19b;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length);
        uVar7 = 0;
        uVar8 = 0;
        uVar6 = 0;
        if (puVar4 == puVar5) goto LAB_002bef9a;
        break;
      case 1:
        puVar4 = puVar5 + 1;
        if (end < puVar4) goto switchD_002bf0a1_caseD_3;
        payload_length = *puVar5;
LAB_002bf0fa:
        uVar7 = 0;
        break;
      case 2:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length_1);
        if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length_1))
        goto switchD_002bf0a1_caseD_3;
        puVar4 = (uint64_t *)((long)puVar3 + payload_length_1);
        uVar7 = payload_length_1;
        payload_length = (uint64_t)puVar3;
        break;
      default:
        goto switchD_002bf0a1_caseD_3;
      case 5:
        puVar4 = (uint64_t *)((long)puVar5 + 4);
        if (puVar4 <= end) {
          payload_length = (uint64_t)(uint)*puVar5;
          goto LAB_002bf0fa;
        }
        goto switchD_002bf0a1_caseD_3;
      }
      raw = puVar4;
    } while ((0xffff < uVar9) || (0xfffffff < uVar7));
    uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
    uVar6 = payload_length;
  } while( true );
switchD_002bee87_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_002bef84;
switchD_002bf0a1_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_002bef9a;
}

Assistant:

bool PerfEventConfig_CallstackSampling::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* scope */:
        (*scope_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* kernel_frames */:
        field.get(&kernel_frames_);
        break;
      case 3 /* user_frames */:
        field.get(&user_frames_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}